

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::mutex::unlock(mutex *this)

{
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void mutex::unlock()
    {
#ifdef CRNLIB_BUILD_DEBUG
        if (!m_lock_count)
        {
            crnlib_assert("mutex::unlock: mutex is not locked", __FILE__, __LINE__);
        }
        m_lock_count--;
#endif
        pthread_mutex_unlock(&m_mutex);
    }